

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_return(function *fn,int A,int B,int pc)

{
  int pc_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  membuff_add_string(&fn->body,"if (cl->p->sizep > 0) {\n luaF_close(L, base, LUA_OK);\n");
  membuff_add_string(&fn->body," base = ci->u.l.base;\n");
  membuff_add_string(&fn->body,"}\n");
  emit_reg(fn,"ra",A);
  membuff_add_fstring(&fn->body,"result = (%d != 0 ? %d - 1 : cast_int(L->top - ra));\n",
                      (ulong)(uint)B,(ulong)(uint)B);
  membuff_add_string(&fn->body,"return luaD_poscall(L, ci, ra, result);\n");
  return;
}

Assistant:

static void emit_op_return(struct function *fn, int A, int B, int pc) {
  (void)pc;
#ifdef RAVI_DEFER_STATEMENT
  membuff_add_string(&fn->body, "if (cl->p->sizep > 0) {\n luaF_close(L, base, LUA_OK);\n");
  membuff_add_string(&fn->body, " base = ci->u.l.base;\n");
  membuff_add_string(&fn->body, "}\n");
#else
  membuff_add_string(&fn->body, "if (cl->p->sizep > 0) luaF_close(L, base);\n");
#endif
  emit_reg(fn, "ra", A);
  membuff_add_fstring(&fn->body, "result = (%d != 0 ? %d - 1 : cast_int(L->top - ra));\n", B, B);
  membuff_add_string(&fn->body, "return luaD_poscall(L, ci, ra, result);\n");
}